

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_init(gb_joypad_t *joypad,gb *gb)

{
  uint __line;
  char *__assertion;
  
  if (joypad == (gb_joypad_t *)0x0) {
    __assertion = "joypad != NULL";
    __line = 10;
  }
  else {
    if (gb != (gb *)0x0) {
      joypad->gb = gb;
      joypad->state = 0;
      joypad->reg_joyp = 0xcf;
      return;
    }
    __assertion = "gb != NULL";
    __line = 0xb;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/joypad.c"
                ,__line,"void joypad_init(gb_joypad_t *, struct gb *)");
}

Assistant:

void joypad_init(gb_joypad_t *joypad, struct gb *gb)
{
    assert(joypad != NULL);
    assert(gb != NULL);

    joypad->gb = gb;

    joypad_reset(joypad);
}